

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O2

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerListOverwritesExisting<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_std::mutex>_>
::TestBody(AssignmentFromInitializerListOverwritesExisting<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_std::mutex>_>
           *this)

{
  pair<const_int,_phmap::priv::NonStandardLayout> *last;
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *matcher;
  parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_std::mutex>
  *m_00;
  long lVar1;
  char *message;
  Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> gen;
  vector<std::pair<int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<int,_phmap::priv::NonStandardLayout>_>_>
  local_f60;
  AssertionResult gtest_ar;
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_phmap::priv::NonStandardLayout>_> local_f38;
  allocator_type local_f18;
  pair<const_int,_phmap::priv::NonStandardLayout> local_f10;
  pair<const_int,_phmap::priv::NonStandardLayout> local_ee0;
  pair<const_int,_phmap::priv::NonStandardLayout> local_eb0;
  pair<const_int,_phmap::priv::NonStandardLayout> local_e80;
  pair<const_int,_phmap::priv::NonStandardLayout> local_e50;
  undefined1 local_e20 [1792];
  TypeParam m;
  
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_f10,&gen);
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_ee0,&gen);
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_eb0,&gen);
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_e80,&gen);
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_e50,&gen);
  std::
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner,_16UL>
  ::array((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner,_16UL>
           *)&m);
  local_f60.
  super__Vector_base<std::pair<int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<int,_phmap::priv::NonStandardLayout>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId;
  gtest_ar._0_8_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_f18.id_ = 0;
  last = (pair<const_int,_phmap::priv::NonStandardLayout> *)0x0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       (pointer)((long)&hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
                        next_id<phmap::priv::StatefulTestingHash>()::gId->first + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::parallel_hash_set<std::pair<int_const,phmap::priv::NonStandardLayout>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
              *)local_e20,&local_f10,(pair<const_int,_phmap::priv::NonStandardLayout> *)local_e20,0,
             (hasher *)&local_f60,(key_equal *)&gtest_ar,&local_f18);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::operator=((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
               *)&m,(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
                     *)local_e20);
  std::
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner,_16UL>
  ::~array((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner,_16UL>
            *)local_e20);
  testing::UnorderedElementsAreArray<std::pair<int_const,phmap::priv::NonStandardLayout>const*>
            (&local_f38,(testing *)&local_f10,
             (pair<const_int,_phmap::priv::NonStandardLayout> *)local_e20,last);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,phmap::priv::NonStandardLayout>>>
            ((PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
              *)local_e20,(internal *)&local_f38,matcher);
  items<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,std::mutex>>
            (&local_f60,(priv *)&m,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::operator()(&gtest_ar,local_e20,
               (vector<std::pair<int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<int,_phmap::priv::NonStandardLayout>_>_>
                *)"items(m)");
  std::
  vector<std::pair<int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<int,_phmap::priv::NonStandardLayout>_>_>
  ::~vector(&local_f60);
  std::
  vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~vector((vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             *)(local_e20 + 8));
  std::
  vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~vector(&local_f38.matchers_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_e20);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1d2,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f60,(Message *)local_e20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f60);
    if ((long *)local_e20._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_e20._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner,_16UL>
  ::~array((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner,_16UL>
            *)&m);
  lVar1 = 200;
  do {
    NonStandardLayout::~NonStandardLayout((NonStandardLayout *)((long)&local_f10.first + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerListOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}